

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# open62541.c
# Opt level: O2

void UA_Subscription_answerPublishRequestsNoSubscription(UA_Server *server,UA_NodeId *sessionToken)

{
  UA_PublishResponseEntry *__ptr;
  UA_PublishResponseEntry *pUVar1;
  UA_Session *pUVar2;
  UA_DateTime UVar3;
  UA_ListOfQueuedPublishResponses *pUVar4;
  
  pUVar2 = UA_SessionManager_getSession(&server->sessionManager,sessionToken);
  UA_delete(sessionToken,UA_TYPES + 0x10);
  if ((pUVar2 != (UA_Session *)0x0) &&
     ((pUVar2->serverSubscriptions).lh_first == (UA_Subscription *)0x0)) {
    pUVar4 = &pUVar2->responseQueue;
    while (__ptr = pUVar4->sqh_first, __ptr != (UA_PublishResponseEntry *)0x0) {
      pUVar1 = (__ptr->listEntry).sqe_next;
      pUVar4->sqh_first = pUVar1;
      if (pUVar1 == (UA_PublishResponseEntry *)0x0) {
        (pUVar2->responseQueue).sqh_last = &pUVar4->sqh_first;
      }
      (__ptr->response).responseHeader.serviceResult = 0x80790000;
      UVar3 = UA_DateTime_now();
      (__ptr->response).responseHeader.timestamp = UVar3;
      UA_SecureChannel_sendBinaryMessage
                (pUVar2->channel,__ptr->requestId,&__ptr->response,UA_TYPES + 0x4e);
      UA_PublishResponse_deleteMembers(&__ptr->response);
      free(__ptr);
    }
  }
  return;
}

Assistant:

void
UA_Subscription_answerPublishRequestsNoSubscription(UA_Server *server, UA_NodeId *sessionToken) {
    /* Get session */
    UA_Session *session = UA_SessionManager_getSession(&server->sessionManager, sessionToken);
    UA_NodeId_delete(sessionToken);

    /* No session or there are remaining subscriptions */
    if(!session || LIST_FIRST(&session->serverSubscriptions))
        return;

    /* Send a response for every queued request */
    UA_PublishResponseEntry *pre;
    while((pre = SIMPLEQ_FIRST(&session->responseQueue))) {
        SIMPLEQ_REMOVE_HEAD(&session->responseQueue, listEntry);
        UA_PublishResponse *response = &pre->response;
        response->responseHeader.serviceResult = UA_STATUSCODE_BADNOSUBSCRIPTION;
        response->responseHeader.timestamp = UA_DateTime_now();
        UA_SecureChannel_sendBinaryMessage(session->channel, pre->requestId, response,
                                           &UA_TYPES[UA_TYPES_PUBLISHRESPONSE]);
        UA_PublishResponse_deleteMembers(response);
        UA_free(pre);
    }
}